

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableMergeDrawChannels(ImGuiTable *table)

{
  ImVector<ImDrawChannel> *this;
  ImVec2 *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec4 IVar5;
  char cVar6;
  char cVar7;
  byte bVar8;
  ImDrawListSplitter *pIVar9;
  undefined1 auVar10 [12];
  undefined4 uVar11;
  undefined4 uVar12;
  int iVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  int iVar16;
  ImGuiContext *pIVar17;
  bool bVar18;
  int n;
  uint uVar19;
  int iVar20;
  ImGuiTableColumn *pIVar21;
  ImDrawChannel *pIVar22;
  ImDrawCmd *pIVar23;
  long lVar24;
  ImDrawChannel *pIVar25;
  ImDrawChannel *pIVar26;
  int iVar27;
  int n_1;
  int iVar28;
  MergeGroup *this_00;
  ImBitArray<132> *pIVar29;
  ulong uVar30;
  uint uVar31;
  float fVar32;
  float fVar33;
  float fVar36;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar37;
  float fVar38;
  int local_168;
  uint local_148;
  ImBitArray<132> remaining_mask;
  MergeGroup merge_groups [4];
  
  pIVar17 = GImGui;
  pIVar9 = table->DrawSplitter;
  if (pIVar9->_Current != 0) {
    __assert_fail("splitter->_Current == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                  ,0x918,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
  }
  cVar6 = table->FreezeRowsCount;
  cVar7 = table->FreezeColumnsCount;
  uVar30 = 0;
  memset(merge_groups,0,0xa0);
  this = &pIVar9->_Channels;
  local_148 = 0;
  do {
    if ((long)table->ColumnsCount <= (long)uVar30) {
      if (local_148 != 0) {
        ImVector<ImDrawChannel>::resize(&pIVar17->DrawChannelsTempMergeBuffer,pIVar9->_Count + -2);
        pIVar22 = (pIVar17->DrawChannelsTempMergeBuffer).Data;
        remaining_mask.Storage[0] = 0;
        remaining_mask.Storage[1] = 0;
        remaining_mask.Storage[2] = 0;
        remaining_mask.Storage[3] = 0;
        remaining_mask.Storage[4] = 0;
        ImBitArraySetBitRange(remaining_mask.Storage,2,pIVar9->_Count);
        ImBitArray<132>::ClearBit(&remaining_mask,(uint)table->Bg2DrawChannelUnfrozen);
        if (cVar6 < '\x01') {
          local_168 = -2;
        }
        else {
          if (table->Bg2DrawChannelUnfrozen == '\x01') {
            __assert_fail("has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                          ,0x974,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
          }
          local_168 = -3;
        }
        local_168 = local_168 + pIVar9->_Count;
        fVar32 = (table->HostClipRect).Min.x;
        fVar2 = (table->HostClipRect).Min.y;
        fVar3 = (table->HostClipRect).Max.x;
        fVar4 = (table->HostClipRect).Max.y;
        pIVar29 = &merge_groups[0].ChannelsMask;
        for (uVar30 = 0; uVar30 != 4; uVar30 = uVar30 + 1) {
          iVar27 = merge_groups[uVar30].ChannelsCount;
          if (iVar27 != 0) {
            fVar33 = merge_groups[uVar30].ClipRect.Min.x;
            fVar36 = merge_groups[uVar30].ClipRect.Min.y;
            fVar37 = merge_groups[uVar30].ClipRect.Max.x;
            fVar38 = merge_groups[uVar30].ClipRect.Max.y;
            if (((uVar30 & 1) == 0 || cVar7 < '\x01') && (fVar32 <= fVar33)) {
              fVar33 = fVar32;
            }
            if ((uVar30 < 2 || cVar6 < '\x01') && (fVar2 <= fVar36)) {
              fVar36 = fVar2;
            }
            if ((uVar30 & 1) != 0) {
              uVar31 = -(uint)(fVar3 <= fVar37);
              fVar37 = (float)(~uVar31 & (uint)fVar3 | (uint)fVar37 & uVar31);
            }
            if ((1 < uVar30) && ((table->Flags & 0x20000) == 0)) {
              uVar31 = -(uint)(fVar4 <= fVar38);
              fVar38 = (float)(~uVar31 & (uint)fVar4 | (uint)fVar38 & uVar31);
            }
            for (lVar24 = 0; lVar24 != 5; lVar24 = lVar24 + 1) {
              remaining_mask.Storage[lVar24] =
                   remaining_mask.Storage[lVar24] & ~pIVar29->Storage[lVar24];
            }
            local_168 = local_168 - iVar27;
            iVar28 = 0;
            while ((iVar28 < pIVar9->_Count && (iVar27 != 0))) {
              bVar18 = ImBitArray<132>::TestBit(&merge_groups[uVar30].ChannelsMask,iVar28);
              if (bVar18) {
                ImBitArray<132>::ClearBit(&merge_groups[uVar30].ChannelsMask,iVar28);
                pIVar25 = ImVector<ImDrawChannel>::operator[](this,iVar28);
                if ((pIVar25->_CmdBuffer).Size != 1) {
LAB_0015fbe5:
                  __assert_fail("channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect))"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                                ,0x99f,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
                }
                pIVar23 = ImVector<ImDrawCmd>::operator[](&pIVar25->_CmdBuffer,0);
                IVar5 = pIVar23->ClipRect;
                auVar35._4_4_ = -(uint)(fVar36 <= IVar5.y);
                auVar35._0_4_ = -(uint)(fVar33 <= IVar5.x);
                auVar10._4_8_ = IVar5._8_8_;
                auVar10._0_4_ = -(uint)(IVar5.y <= fVar36);
                auVar34._0_8_ = auVar10._0_8_ << 0x20;
                auVar34._8_4_ = -(uint)(IVar5.z <= fVar37);
                auVar34._12_4_ = -(uint)(IVar5.w <= fVar38);
                auVar35._8_8_ = auVar34._8_8_;
                iVar20 = movmskps((int)pIVar23,auVar35);
                if (iVar20 != 0xf) goto LAB_0015fbe5;
                iVar27 = iVar27 + -1;
                pIVar23 = ImVector<ImDrawCmd>::operator[](&pIVar25->_CmdBuffer,0);
                (pIVar23->ClipRect).x = fVar33;
                (pIVar23->ClipRect).y = fVar36;
                (pIVar23->ClipRect).z = fVar37;
                (pIVar23->ClipRect).w = fVar38;
                iVar16 = (pIVar25->_CmdBuffer).Capacity;
                uVar14 = *(undefined4 *)&(pIVar25->_CmdBuffer).Data;
                uVar15 = *(undefined4 *)((long)&(pIVar25->_CmdBuffer).Data + 4);
                iVar20 = (pIVar25->_IdxBuffer).Size;
                iVar13 = (pIVar25->_IdxBuffer).Capacity;
                uVar11 = *(undefined4 *)&(pIVar25->_IdxBuffer).Data;
                uVar12 = *(undefined4 *)((long)&(pIVar25->_IdxBuffer).Data + 4);
                (pIVar22->_CmdBuffer).Size = (pIVar25->_CmdBuffer).Size;
                (pIVar22->_CmdBuffer).Capacity = iVar16;
                *(undefined4 *)&(pIVar22->_CmdBuffer).Data = uVar14;
                *(undefined4 *)((long)&(pIVar22->_CmdBuffer).Data + 4) = uVar15;
                (pIVar22->_IdxBuffer).Size = iVar20;
                (pIVar22->_IdxBuffer).Capacity = iVar13;
                *(undefined4 *)&(pIVar22->_IdxBuffer).Data = uVar11;
                *(undefined4 *)((long)&(pIVar22->_IdxBuffer).Data + 4) = uVar12;
                pIVar22 = pIVar22 + 1;
              }
              iVar28 = iVar28 + 1;
            }
          }
          pIVar25 = pIVar22;
          if (uVar30 == 1 && '\0' < cVar6) {
            pIVar25 = pIVar22 + 1;
            pIVar26 = ImVector<ImDrawChannel>::operator[](this,(uint)table->Bg2DrawChannelUnfrozen);
            iVar20 = (pIVar26->_CmdBuffer).Capacity;
            uVar14 = *(undefined4 *)&(pIVar26->_CmdBuffer).Data;
            uVar15 = *(undefined4 *)((long)&(pIVar26->_CmdBuffer).Data + 4);
            iVar27 = (pIVar26->_IdxBuffer).Size;
            iVar28 = (pIVar26->_IdxBuffer).Capacity;
            uVar11 = *(undefined4 *)&(pIVar26->_IdxBuffer).Data;
            uVar12 = *(undefined4 *)((long)&(pIVar26->_IdxBuffer).Data + 4);
            (pIVar22->_CmdBuffer).Size = (pIVar26->_CmdBuffer).Size;
            (pIVar22->_CmdBuffer).Capacity = iVar20;
            *(undefined4 *)&(pIVar22->_CmdBuffer).Data = uVar14;
            *(undefined4 *)((long)&(pIVar22->_CmdBuffer).Data + 4) = uVar15;
            (pIVar22->_IdxBuffer).Size = iVar27;
            (pIVar22->_IdxBuffer).Capacity = iVar28;
            *(undefined4 *)&(pIVar22->_IdxBuffer).Data = uVar11;
            *(undefined4 *)((long)&(pIVar22->_IdxBuffer).Data + 4) = uVar12;
          }
          pIVar29 = pIVar29 + 2;
          pIVar22 = pIVar25;
        }
        iVar27 = 0;
        while ((iVar27 < pIVar9->_Count && (local_168 != 0))) {
          bVar18 = ImBitArray<132>::TestBit(&remaining_mask,iVar27);
          if (bVar18) {
            pIVar25 = ImVector<ImDrawChannel>::operator[](this,iVar27);
            iVar13 = (pIVar25->_CmdBuffer).Capacity;
            pIVar23 = (pIVar25->_CmdBuffer).Data;
            iVar28 = (pIVar25->_IdxBuffer).Size;
            iVar20 = (pIVar25->_IdxBuffer).Capacity;
            uVar11 = *(undefined4 *)&(pIVar25->_IdxBuffer).Data;
            uVar12 = *(undefined4 *)((long)&(pIVar25->_IdxBuffer).Data + 4);
            (pIVar22->_CmdBuffer).Size = (pIVar25->_CmdBuffer).Size;
            (pIVar22->_CmdBuffer).Capacity = iVar13;
            (pIVar22->_CmdBuffer).Data = pIVar23;
            (pIVar22->_IdxBuffer).Size = iVar28;
            (pIVar22->_IdxBuffer).Capacity = iVar20;
            *(undefined4 *)&(pIVar22->_IdxBuffer).Data = uVar11;
            *(undefined4 *)((long)&(pIVar22->_IdxBuffer).Data + 4) = uVar12;
            pIVar22 = pIVar22 + 1;
            local_168 = local_168 + -1;
          }
          iVar27 = iVar27 + 1;
        }
        pIVar25 = (pIVar17->DrawChannelsTempMergeBuffer).Data;
        if (pIVar22 != pIVar25 + (pIVar17->DrawChannelsTempMergeBuffer).Size) {
          __assert_fail("dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                        ,0x9b3,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
        }
        memcpy((pIVar9->_Channels).Data + 2,pIVar25,(long)pIVar9->_Count * 0x20 - 0x40);
      }
      return;
    }
    if ((table->VisibleMaskByIndex >> (uVar30 & 0x3f) & 1) != 0) {
      pIVar21 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)uVar30);
      for (iVar27 = 0; ('\0' < cVar6) + 1 != iVar27; iVar27 = iVar27 + 1) {
        bVar8 = *(byte *)((long)pIVar21 + (0x59 - (ulong)(iVar27 == 0)));
        pIVar22 = ImVector<ImDrawChannel>::operator[](this,(uint)bVar8);
        if (0 < (pIVar22->_CmdBuffer).Size) {
          pIVar23 = ImVector<ImDrawCmd>::back(&pIVar22->_CmdBuffer);
          if (pIVar23->ElemCount == 0) {
            ImVector<ImDrawCmd>::pop_back(&pIVar22->_CmdBuffer);
          }
          if ((pIVar22->_CmdBuffer).Size == 1) {
            if ((pIVar21->Flags & 0x100) == 0) {
              if (cVar6 < '\x01') {
                fVar32 = pIVar21->ContentMaxXUnfrozen;
LAB_0015f769:
                uVar31 = -(uint)(pIVar21->ContentMaxXHeadersUsed <= fVar32);
                fVar32 = (float)(~uVar31 & (uint)pIVar21->ContentMaxXHeadersUsed |
                                (uint)fVar32 & uVar31);
              }
              else {
                if (iVar27 == 0) {
                  fVar32 = pIVar21->ContentMaxXFrozen;
                  goto LAB_0015f769;
                }
                fVar32 = pIVar21->ContentMaxXUnfrozen;
              }
              pIVar1 = &(pIVar21->ClipRect).Max;
              if (pIVar1->x <= fVar32 && fVar32 != pIVar1->x) goto LAB_0015f83b;
            }
            uVar31 = 1;
            if ('\0' < cVar7) {
              uVar31 = (uint)((long)table->FreezeColumnsCount <= (long)uVar30);
            }
            uVar19 = (uint)(iVar27 != 0) * 2;
            if (cVar6 < '\x01') {
              uVar19 = 2;
            }
            if (0x83 < bVar8) {
              __assert_fail("channel_no < (4 + 64 * 2)",
                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                            ,0x949,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
            }
            uVar31 = uVar31 | uVar19;
            this_00 = merge_groups + uVar31;
            if (merge_groups[uVar31].ChannelsCount == 0) {
              (this_00->ClipRect).Min.x = 3.4028235e+38;
              (this_00->ClipRect).Min.y = 3.4028235e+38;
              merge_groups[uVar31].ClipRect.Max.x = -3.4028235e+38;
              merge_groups[uVar31].ClipRect.Max.y = -3.4028235e+38;
            }
            ImBitArray<132>::SetBit(&merge_groups[uVar31].ChannelsMask,(uint)bVar8);
            merge_groups[uVar31].ChannelsCount = merge_groups[uVar31].ChannelsCount + 1;
            pIVar23 = ImVector<ImDrawCmd>::operator[](&pIVar22->_CmdBuffer,0);
            remaining_mask.Storage[0] = (ImU32)(pIVar23->ClipRect).x;
            remaining_mask.Storage[1] = (ImU32)(pIVar23->ClipRect).y;
            remaining_mask.Storage[2] = (ImU32)(pIVar23->ClipRect).z;
            remaining_mask.Storage[3] = (ImU32)(pIVar23->ClipRect).w;
            ImRect::Add(&this_00->ClipRect,(ImRect *)&remaining_mask);
            local_148 = local_148 | 1 << uVar31;
          }
        }
LAB_0015f83b:
      }
      pIVar21->DrawChannelCurrent = 0xff;
    }
    uVar30 = uVar30 + 1;
  } while( true );
}

Assistant:

void ImGui::TableMergeDrawChannels(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);
    IM_ASSERT(splitter->_Current == 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;

        MergeGroup() { ChannelsCount = 0; }
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0)
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImGuiTableDrawChannelIdx)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0/Bg1) and 1 (Bg2 frozen) from the shuffling since they won't move - see channels allocation in TableSetupDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count);
        remaining_mask.ClearBit(table->Bg2DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, 0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg2DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0/Bg1 and Bg2 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg2DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}